

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siamese.cpp
# Opt level: O2

SiameseResult
siamese_decode(SiameseDecoder decoder_t,SiameseOriginalPacket **packetsPtrOut,uint *countOut)

{
  SiameseResult SVar1;
  Decoder *decoder;
  
  if ((decoder_t != (SiameseDecoder)0x0) &&
     ((packetsPtrOut == (SiameseOriginalPacket **)0x0) != (countOut != (uint *)0x0))) {
    SVar1 = siamese::Decoder::Decode((Decoder *)decoder_t,packetsPtrOut,countOut);
    return SVar1;
  }
  return Siamese_InvalidInput;
}

Assistant:

SIAMESE_EXPORT SiameseResult siamese_decode(
    SiameseDecoder decoder_t,
    SiameseOriginalPacket** packetsPtrOut,
    unsigned* countOut)
{
    siamese::Decoder* decoder = reinterpret_cast<siamese::Decoder*>(decoder_t);
    if (!decoder || (!packetsPtrOut != !countOut))
        return Siamese_InvalidInput;

    return decoder->Decode(
        packetsPtrOut,
        countOut);
}